

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O3

error<idx2::err_code> idx2::WriteVolume(FILE *Fp,volume *Vol,grid *Grid)

{
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  long *in_FS_OFFSET;
  error<idx2::err_code> eVar4;
  grid_iterator<signed_char> It;
  grid_iterator<signed_char> EndIt;
  grid_iterator<double> local_98;
  grid_iterator<double> local_60;
  
  switch(Vol->Type) {
  case int8:
    End<signed_char>((grid_iterator<signed_char> *)&local_60,Grid,Vol);
    Begin<signed_char>((grid_iterator<signed_char> *)&local_98,Grid,Vol);
    if (local_98.Ptr != local_60.Ptr) {
      do {
        sVar1 = fwrite(local_98.Ptr,1,1,(FILE *)Fp);
        if (sVar1 != 1) goto LAB_00188a32;
        local_98.P.field_0.field_0.X = local_98.P.field_0.field_0.X + local_98.S.field_0.field_0.X;
        local_98.Ptr = (double *)((long)local_98.S.field_0.field_0.X + (long)local_98.Ptr);
        if (local_98.D.field_0.field_0.X <= local_98.P.field_0.field_0.X) {
          local_98.P.field_0.field_0.X = 0;
          local_98.P.field_0.field_0.Y = local_98.P.field_0.field_0.Y + local_98.S.field_0.field_0.Y
          ;
          lVar2 = (long)local_98.N.field_0.field_0.X;
          local_98.Ptr = (double *)
                         ((long)local_98.Ptr +
                         (local_98.S.field_0.field_0.Y * lVar2 - (long)local_98.D.field_0.field_0.X)
                         );
          if (local_98.D.field_0.field_0.Y <= local_98.P.field_0.field_0.Y) {
            local_98.P.field_0.field_0.Y = 0;
            local_98.P.field_0.field_0.Z =
                 local_98.P.field_0.field_0.Z + local_98.S.field_0.field_0.Z;
            local_98.Ptr = (double *)
                           ((long)local_98.Ptr +
                           ((long)local_98.N.field_0.field_0.Y *
                            local_98.S.field_0.field_0.Z * lVar2 -
                           local_98.D.field_0.field_0.Y * lVar2));
          }
        }
      } while (local_98.Ptr != local_60.Ptr);
    }
    break;
  case uint8:
    End<unsigned_char>((grid_iterator<unsigned_char> *)&local_60,Grid,Vol);
    Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_98,Grid,Vol);
    if (local_98.Ptr != local_60.Ptr) {
      do {
        sVar1 = fwrite(local_98.Ptr,1,1,(FILE *)Fp);
        if (sVar1 != 1) goto LAB_00188a32;
        local_98.P.field_0.field_0.X = local_98.P.field_0.field_0.X + local_98.S.field_0.field_0.X;
        local_98.Ptr = (double *)((long)local_98.S.field_0.field_0.X + (long)local_98.Ptr);
        if (local_98.D.field_0.field_0.X <= local_98.P.field_0.field_0.X) {
          local_98.P.field_0.field_0.X = 0;
          local_98.P.field_0.field_0.Y = local_98.P.field_0.field_0.Y + local_98.S.field_0.field_0.Y
          ;
          lVar2 = (long)local_98.N.field_0.field_0.X;
          local_98.Ptr = (double *)
                         ((long)local_98.Ptr +
                         (local_98.S.field_0.field_0.Y * lVar2 - (long)local_98.D.field_0.field_0.X)
                         );
          if (local_98.D.field_0.field_0.Y <= local_98.P.field_0.field_0.Y) {
            local_98.P.field_0.field_0.Y = 0;
            local_98.P.field_0.field_0.Z =
                 local_98.P.field_0.field_0.Z + local_98.S.field_0.field_0.Z;
            local_98.Ptr = (double *)
                           ((long)local_98.Ptr +
                           ((long)local_98.N.field_0.field_0.Y *
                            local_98.S.field_0.field_0.Z * lVar2 -
                           local_98.D.field_0.field_0.Y * lVar2));
          }
        }
      } while (local_98.Ptr != local_60.Ptr);
    }
    break;
  case int16:
    End<short>((grid_iterator<short> *)&local_60,Grid,Vol);
    Begin<short>((grid_iterator<short> *)&local_98,Grid,Vol);
    if (local_98.Ptr != local_60.Ptr) {
      do {
        sVar1 = fwrite(local_98.Ptr,2,1,(FILE *)Fp);
        if (sVar1 != 1) goto LAB_00188a32;
        local_98.P.field_0.field_0.X = local_98.P.field_0.field_0.X + local_98.S.field_0.field_0.X;
        local_98.Ptr = (double *)((long)local_98.S.field_0.field_0.X * 2 + (long)local_98.Ptr);
        if (local_98.D.field_0.field_0.X <= local_98.P.field_0.field_0.X) {
          local_98.P.field_0.field_0.X = 0;
          local_98.P.field_0.field_0.Y = local_98.P.field_0.field_0.Y + local_98.S.field_0.field_0.Y
          ;
          lVar2 = (long)local_98.N.field_0.field_0.X;
          local_98.Ptr = (double *)
                         ((long)local_98.Ptr +
                         local_98.S.field_0.field_0.Y * lVar2 * 2 +
                         (long)local_98.D.field_0.field_0.X * -2);
          if (local_98.D.field_0.field_0.Y <= local_98.P.field_0.field_0.Y) {
            local_98.P.field_0.field_0.Y = 0;
            local_98.P.field_0.field_0.Z =
                 local_98.P.field_0.field_0.Z + local_98.S.field_0.field_0.Z;
            local_98.Ptr = (double *)
                           ((long)local_98.Ptr +
                           (long)local_98.N.field_0.field_0.Y * local_98.S.field_0.field_0.Z * lVar2
                           * 2 + local_98.D.field_0.field_0.Y * lVar2 * -2);
          }
        }
      } while (local_98.Ptr != local_60.Ptr);
    }
    break;
  case uint16:
    End<unsigned_short>((grid_iterator<unsigned_short> *)&local_60,Grid,Vol);
    Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_98,Grid,Vol);
    if (local_98.Ptr != local_60.Ptr) {
      do {
        sVar1 = fwrite(local_98.Ptr,2,1,(FILE *)Fp);
        if (sVar1 != 1) goto LAB_00188a32;
        local_98.P.field_0.field_0.X = local_98.P.field_0.field_0.X + local_98.S.field_0.field_0.X;
        local_98.Ptr = (double *)((long)local_98.S.field_0.field_0.X * 2 + (long)local_98.Ptr);
        if (local_98.D.field_0.field_0.X <= local_98.P.field_0.field_0.X) {
          local_98.P.field_0.field_0.X = 0;
          local_98.P.field_0.field_0.Y = local_98.P.field_0.field_0.Y + local_98.S.field_0.field_0.Y
          ;
          lVar2 = (long)local_98.N.field_0.field_0.X;
          local_98.Ptr = (double *)
                         ((long)local_98.Ptr +
                         local_98.S.field_0.field_0.Y * lVar2 * 2 +
                         (long)local_98.D.field_0.field_0.X * -2);
          if (local_98.D.field_0.field_0.Y <= local_98.P.field_0.field_0.Y) {
            local_98.P.field_0.field_0.Y = 0;
            local_98.P.field_0.field_0.Z =
                 local_98.P.field_0.field_0.Z + local_98.S.field_0.field_0.Z;
            local_98.Ptr = (double *)
                           ((long)local_98.Ptr +
                           (long)local_98.N.field_0.field_0.Y * local_98.S.field_0.field_0.Z * lVar2
                           * 2 + local_98.D.field_0.field_0.Y * lVar2 * -2);
          }
        }
      } while (local_98.Ptr != local_60.Ptr);
    }
    break;
  case int32:
    End<int>((grid_iterator<int> *)&local_60,Grid,Vol);
    Begin<int>((grid_iterator<int> *)&local_98,Grid,Vol);
    if (local_98.Ptr != local_60.Ptr) {
      do {
        sVar1 = fwrite(local_98.Ptr,4,1,(FILE *)Fp);
        if (sVar1 != 1) goto LAB_00188a32;
        local_98.P.field_0.field_0.X = local_98.P.field_0.field_0.X + local_98.S.field_0.field_0.X;
        local_98.Ptr = (double *)((long)local_98.S.field_0.field_0.X * 4 + (long)local_98.Ptr);
        if (local_98.D.field_0.field_0.X <= local_98.P.field_0.field_0.X) {
          local_98.P.field_0.field_0.X = 0;
          local_98.P.field_0.field_0.Y = local_98.P.field_0.field_0.Y + local_98.S.field_0.field_0.Y
          ;
          lVar2 = (long)local_98.N.field_0.field_0.X;
          local_98.Ptr = (double *)
                         ((long)local_98.Ptr +
                         local_98.S.field_0.field_0.Y * lVar2 * 4 +
                         (long)local_98.D.field_0.field_0.X * -4);
          if (local_98.D.field_0.field_0.Y <= local_98.P.field_0.field_0.Y) {
            local_98.P.field_0.field_0.Y = 0;
            local_98.P.field_0.field_0.Z =
                 local_98.P.field_0.field_0.Z + local_98.S.field_0.field_0.Z;
            local_98.Ptr = (double *)
                           ((long)local_98.Ptr +
                           (long)local_98.N.field_0.field_0.Y * local_98.S.field_0.field_0.Z * lVar2
                           * 4 + local_98.D.field_0.field_0.Y * lVar2 * -4);
          }
        }
      } while (local_98.Ptr != local_60.Ptr);
    }
    break;
  case uint32:
    End<unsigned_int>((grid_iterator<unsigned_int> *)&local_60,Grid,Vol);
    Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_98,Grid,Vol);
    if (local_98.Ptr != local_60.Ptr) {
      do {
        sVar1 = fwrite(local_98.Ptr,4,1,(FILE *)Fp);
        if (sVar1 != 1) goto LAB_00188a32;
        local_98.P.field_0.field_0.X = local_98.P.field_0.field_0.X + local_98.S.field_0.field_0.X;
        local_98.Ptr = (double *)((long)local_98.S.field_0.field_0.X * 4 + (long)local_98.Ptr);
        if (local_98.D.field_0.field_0.X <= local_98.P.field_0.field_0.X) {
          local_98.P.field_0.field_0.X = 0;
          local_98.P.field_0.field_0.Y = local_98.P.field_0.field_0.Y + local_98.S.field_0.field_0.Y
          ;
          lVar2 = (long)local_98.N.field_0.field_0.X;
          local_98.Ptr = (double *)
                         ((long)local_98.Ptr +
                         local_98.S.field_0.field_0.Y * lVar2 * 4 +
                         (long)local_98.D.field_0.field_0.X * -4);
          if (local_98.D.field_0.field_0.Y <= local_98.P.field_0.field_0.Y) {
            local_98.P.field_0.field_0.Y = 0;
            local_98.P.field_0.field_0.Z =
                 local_98.P.field_0.field_0.Z + local_98.S.field_0.field_0.Z;
            local_98.Ptr = (double *)
                           ((long)local_98.Ptr +
                           (long)local_98.N.field_0.field_0.Y * local_98.S.field_0.field_0.Z * lVar2
                           * 4 + local_98.D.field_0.field_0.Y * lVar2 * -4);
          }
        }
      } while (local_98.Ptr != local_60.Ptr);
    }
    break;
  case int64:
    End<long>((grid_iterator<long> *)&local_60,Grid,Vol);
    Begin<long>((grid_iterator<long> *)&local_98,Grid,Vol);
    if (local_98.Ptr != local_60.Ptr) {
      do {
        sVar1 = fwrite(local_98.Ptr,8,1,(FILE *)Fp);
        if (sVar1 != 1) goto LAB_00188a32;
        local_98.P.field_0.field_0.X = local_98.P.field_0.field_0.X + local_98.S.field_0.field_0.X;
        local_98.Ptr = local_98.Ptr + local_98.S.field_0.field_0.X;
        if (local_98.D.field_0.field_0.X <= local_98.P.field_0.field_0.X) {
          local_98.P.field_0.field_0.X = 0;
          local_98.P.field_0.field_0.Y = local_98.P.field_0.field_0.Y + local_98.S.field_0.field_0.Y
          ;
          lVar2 = (long)local_98.N.field_0.field_0.X;
          local_98.Ptr = local_98.Ptr +
                         (local_98.S.field_0.field_0.Y * lVar2 - (long)local_98.D.field_0.field_0.X)
          ;
          if (local_98.D.field_0.field_0.Y <= local_98.P.field_0.field_0.Y) {
            local_98.P.field_0.field_0.Y = 0;
            local_98.P.field_0.field_0.Z =
                 local_98.P.field_0.field_0.Z + local_98.S.field_0.field_0.Z;
            local_98.Ptr = local_98.Ptr +
                           ((long)local_98.N.field_0.field_0.Y *
                            local_98.S.field_0.field_0.Z * lVar2 -
                           local_98.D.field_0.field_0.Y * lVar2);
          }
        }
      } while (local_98.Ptr != local_60.Ptr);
    }
    break;
  case uint64:
    End<unsigned_long>((grid_iterator<unsigned_long> *)&local_60,Grid,Vol);
    Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_98,Grid,Vol);
    if (local_98.Ptr != local_60.Ptr) {
      do {
        sVar1 = fwrite(local_98.Ptr,8,1,(FILE *)Fp);
        if (sVar1 != 1) goto LAB_00188a32;
        local_98.P.field_0.field_0.X = local_98.P.field_0.field_0.X + local_98.S.field_0.field_0.X;
        local_98.Ptr = local_98.Ptr + local_98.S.field_0.field_0.X;
        if (local_98.D.field_0.field_0.X <= local_98.P.field_0.field_0.X) {
          local_98.P.field_0.field_0.X = 0;
          local_98.P.field_0.field_0.Y = local_98.P.field_0.field_0.Y + local_98.S.field_0.field_0.Y
          ;
          lVar2 = (long)local_98.N.field_0.field_0.X;
          local_98.Ptr = local_98.Ptr +
                         (local_98.S.field_0.field_0.Y * lVar2 - (long)local_98.D.field_0.field_0.X)
          ;
          if (local_98.D.field_0.field_0.Y <= local_98.P.field_0.field_0.Y) {
            local_98.P.field_0.field_0.Y = 0;
            local_98.P.field_0.field_0.Z =
                 local_98.P.field_0.field_0.Z + local_98.S.field_0.field_0.Z;
            local_98.Ptr = local_98.Ptr +
                           ((long)local_98.N.field_0.field_0.Y *
                            local_98.S.field_0.field_0.Z * lVar2 -
                           local_98.D.field_0.field_0.Y * lVar2);
          }
        }
      } while (local_98.Ptr != local_60.Ptr);
    }
    break;
  case float32:
    End<float>((grid_iterator<float> *)&local_60,Grid,Vol);
    Begin<float>((grid_iterator<float> *)&local_98,Grid,Vol);
    if (local_98.Ptr != local_60.Ptr) {
      do {
        sVar1 = fwrite(local_98.Ptr,4,1,(FILE *)Fp);
        if (sVar1 != 1) goto LAB_00188a32;
        local_98.P.field_0.field_0.X = local_98.P.field_0.field_0.X + local_98.S.field_0.field_0.X;
        local_98.Ptr = (double *)((long)local_98.S.field_0.field_0.X * 4 + (long)local_98.Ptr);
        if (local_98.D.field_0.field_0.X <= local_98.P.field_0.field_0.X) {
          local_98.P.field_0.field_0.X = 0;
          local_98.P.field_0.field_0.Y = local_98.P.field_0.field_0.Y + local_98.S.field_0.field_0.Y
          ;
          lVar2 = (long)local_98.N.field_0.field_0.X;
          local_98.Ptr = (double *)
                         ((long)local_98.Ptr +
                         local_98.S.field_0.field_0.Y * lVar2 * 4 +
                         (long)local_98.D.field_0.field_0.X * -4);
          if (local_98.D.field_0.field_0.Y <= local_98.P.field_0.field_0.Y) {
            local_98.P.field_0.field_0.Y = 0;
            local_98.P.field_0.field_0.Z =
                 local_98.P.field_0.field_0.Z + local_98.S.field_0.field_0.Z;
            local_98.Ptr = (double *)
                           ((long)local_98.Ptr +
                           (long)local_98.N.field_0.field_0.Y * local_98.S.field_0.field_0.Z * lVar2
                           * 4 + local_98.D.field_0.field_0.Y * lVar2 * -4);
          }
        }
      } while (local_98.Ptr != local_60.Ptr);
    }
    break;
  case float64:
    End<double>(&local_60,Grid,Vol);
    Begin<double>(&local_98,Grid,Vol);
    if (local_98.Ptr != local_60.Ptr) {
      do {
        sVar1 = fwrite(local_98.Ptr,8,1,(FILE *)Fp);
        if (sVar1 != 1) goto LAB_00188a32;
        local_98.P.field_0.field_0.X = local_98.P.field_0.field_0.X + local_98.S.field_0.field_0.X;
        local_98.Ptr = local_98.Ptr + local_98.S.field_0.field_0.X;
        if (local_98.D.field_0.field_0.X <= local_98.P.field_0.field_0.X) {
          local_98.P.field_0.field_0.X = 0;
          local_98.P.field_0.field_0.Y = local_98.P.field_0.field_0.Y + local_98.S.field_0.field_0.Y
          ;
          lVar2 = (long)local_98.N.field_0.field_0.X;
          local_98.Ptr = local_98.Ptr +
                         (local_98.S.field_0.field_0.Y * lVar2 - (long)local_98.D.field_0.field_0.X)
          ;
          if (local_98.D.field_0.field_0.Y <= local_98.P.field_0.field_0.Y) {
            local_98.P.field_0.field_0.Y = 0;
            local_98.P.field_0.field_0.Z =
                 local_98.P.field_0.field_0.Z + local_98.S.field_0.field_0.Z;
            local_98.Ptr = local_98.Ptr +
                           ((long)local_98.N.field_0.field_0.Y *
                            local_98.S.field_0.field_0.Z * lVar2 -
                           local_98.D.field_0.field_0.Y * lVar2);
          }
        }
      } while (local_98.Ptr != local_60.Ptr);
    }
  }
  *(char **)(*in_FS_OFFSET + -0x780) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x58;
  uVar3 = 0;
LAB_00188a67:
  eVar4.Code = (int)uVar3;
  eVar4.StackIdx = (char)((ulong)uVar3 >> 0x20);
  eVar4.StrGened = (bool)(char)((ulong)uVar3 >> 0x28);
  eVar4._14_2_ = (short)((ulong)uVar3 >> 0x30);
  eVar4.Msg = "";
  return eVar4;
LAB_00188a32:
  *(char **)(*in_FS_OFFSET + -0x780) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x58;
  uVar3 = 0xc;
  goto LAB_00188a67;
}

Assistant:

error<>
WriteVolume(FILE* Fp, const volume& Vol, const grid& Grid)
{
#define Body(type)                                                                                 \
  auto EndIt = End<type>(Grid, Vol);                                                               \
  for (auto It = Begin<type>(Grid, Vol); It != EndIt; ++It)                                        \
  {                                                                                                \
    if (fwrite(&(*It), sizeof(*It), 1, Fp) != 1)                                                   \
      return idx2_Error(err_code::FileWriteFailed);                                                \
  }
  idx2_DispatchOnType(Vol.Type) return idx2_Error(err_code::NoError);
#undef Body
}